

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations2Plane1Line<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *Pi1,
          Matrix<float,_4,_1,_0,_4,_1> *Pi2,Matrix<float,_4,_1,_0,_4,_1> *Nu1,
          Matrix<float,_4,_1,_0,_4,_1> *Nu2,bool verbose)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar5;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pCVar6;
  ostream *poVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  double dVar17;
  float fVar18;
  double dVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  undefined8 local_208;
  uint uStack_200;
  uint uStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  Type local_1d0;
  undefined8 local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  float local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  float local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  undefined8 local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [16];
  Matrix<float,_3,_1,_0,_3,_1> auxT;
  Matrix<float,_4,_4,_0,_4,_4> auxTrans;
  Matrix<float,_3,_3,_0,_3,_3> auxRot;
  
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fVar13 = (Pi1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [0];
  fVar14 = (Pi1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [1];
  fVar12 = (Pi1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [2];
  fVar9 = (Pi2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  local_188 = (Pi2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[1];
  local_178 = (Pi2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[2];
  fVar20 = fVar12 * fVar12;
  fVar21 = fVar14 * fVar14;
  dVar23 = (double)(fVar21 + fVar20);
  fVar10 = fVar13 * fVar14;
  fVar11 = fVar13 * fVar12;
  dVar25 = (double)(fVar14 * local_178 - local_188 * fVar12);
  local_138._0_4_ = fVar13 * fVar13;
  fVar22 = fVar13 * fVar13 + fVar21 + fVar20;
  local_1f8._0_4_ = fVar22;
  local_148 = (double)(((fVar21 * fVar9 + fVar20 * fVar9) - fVar10 * local_188) - fVar11 * local_178
                      );
  dVar19 = local_148 * local_148 * dVar23 + (double)fVar22 * dVar25 * dVar25 * dVar23;
  local_208 = (double)CONCAT44(0x80000000,-fVar12);
  uStack_200 = 0x80000000;
  uStack_1fc = 0x80000000;
  local_20c = (Pi1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  local_164 = (Pi2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  fVar22 = (Nu1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [0];
  local_1e8 = ZEXT416((uint)(Nu1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                            m_storage.m_data.array[1]);
  fVar1 = (Nu1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  local_210 = (Nu1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  fVar2 = (Nu2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (Nu2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (Nu2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  local_168 = (Nu2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  dVar17 = SQRT(dVar19);
  dVar16 = dVar17;
  if (dVar19 < 0.0) {
    local_198 = dVar25;
    dVar16 = sqrt(dVar19);
    dVar25 = local_198;
  }
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       (PointerType)&auxRot;
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.m_value
       = 0;
  auxRot.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (float)((1.0 / dVar16) * dVar25 * dVar23);
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.m_value
       = 1;
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)0x1;
  if (dVar19 < 0.0) {
    dVar17 = sqrt(dVar19);
  }
  local_214 = (float)((double)(fVar13 * local_178 + fVar9 * (float)local_208) * (-1.0 / dVar17) *
                     dVar23);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_1d0,
                      &local_214);
  if (dVar19 < 0.0) {
    dVar16 = sqrt(dVar19);
  }
  else {
    dVar16 = SQRT(dVar19);
  }
  local_218 = (float)((double)(fVar13 * local_188 - fVar9 * fVar14) * (1.0 / dVar16) * dVar23);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_218);
  if (dVar19 < 0.0) {
    dVar16 = sqrt(dVar19);
  }
  else {
    dVar16 = SQRT(dVar19);
  }
  fVar8 = SQRT((float)local_1f8._0_4_);
  local_1f8._0_4_ = fVar8;
  local_198 = (double)fVar8;
  local_14c = (float)((((-1.0 / dVar16) * dVar23) / local_198) * local_148);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_14c);
  local_148._0_4_ = -fVar10;
  uStack_140 = 0x80000000;
  uStack_13c = 0x80000000;
  if (dVar19 < 0.0) {
    local_148 = (double)CONCAT44(0x80000000,(float)local_148);
    dVar16 = sqrt(dVar19);
  }
  else {
    dVar16 = SQRT(dVar19);
  }
  fVar8 = (float)local_148 * fVar9;
  local_148._0_4_ = fVar14 * fVar12;
  local_148._4_4_ = 0;
  uStack_140 = 0;
  uStack_13c = 0;
  local_150 = (float)((double)((fVar8 + (float)local_138._0_4_ * local_188 + fVar20 * local_188) -
                              (float)local_148 * local_178) *
                     (((-1.0 / dVar16) * dVar23) / local_198));
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_150);
  fVar8 = -(float)local_148;
  if (dVar19 < 0.0) {
    dVar19 = sqrt(dVar19);
  }
  else {
    dVar19 = SQRT(dVar19);
  }
  local_154 = (float)((double)(fVar8 * local_188 +
                              -fVar11 * fVar9 +
                              (float)local_138._0_4_ * local_178 + fVar21 * local_178) *
                     (((-1.0 / dVar19) * dVar23) / local_198));
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_154);
  local_158 = fVar13 / (float)local_1f8._0_4_;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_158);
  local_15c = fVar14 / (float)local_1f8._0_4_;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_15c);
  local_160 = fVar12 / (float)local_1f8._0_4_;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar5,&local_160);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_1d0);
  dVar16 = -1.0 / local_198;
  fVar12 = fVar21 * local_164;
  fVar8 = (float)local_138._0_4_ * local_164;
  fVar18 = local_164 * fVar20;
  fVar13 = fVar13 * local_20c;
  fVar14 = -fVar14 * local_20c * local_188;
  fVar15 = (float)local_208 * local_20c * local_178;
  dVar17 = (double)(fVar10 * fVar9 * local_188);
  dVar19 = (double)(fVar11 * fVar9 * local_178);
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       (PointerType)&auxT;
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.m_value
       = 0;
  auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  dVar25 = (double)((float)local_148 * local_188 * local_178);
  dVar17 = (((double)(local_188 * local_188 * fVar20 +
                     local_178 * local_178 * fVar21 +
                     fVar9 * fVar9 * fVar20 +
                     (float)local_138._0_4_ * local_178 * local_178 +
                     (float)local_138._0_4_ * local_188 * local_188 + fVar21 * fVar9 * fVar9) -
            (dVar17 + dVar17)) - (dVar19 + dVar19)) - (dVar25 + dVar25);
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.m_value
       = 1;
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)0x1;
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  local_214 = (float)(((double)(fVar15 + fVar14 + ((fVar18 + fVar8 + fVar12) - fVar13 * fVar9)) *
                      dVar16) / dVar17);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_1d0,
                      &local_214);
  local_218 = local_20c / (float)local_1f8._0_4_;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar6,&local_218);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_1d0);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity
            ((IdentityReturnType *)&local_1d0,4,4);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,4,4,0,4,4>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            (&auxTrans,
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
              *)&local_1d0);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>(&local_1d0,&auxTrans,3,3)
  ;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
            (&local_1d0,&auxRot);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_1d0,&auxTrans,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,1,0,3,1>>
            (&local_1d0,&auxT);
  if (verbose) {
    poVar7 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix [U,u;0,0,0,1]");
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&auxTrans);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)");
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)&auxTrans;
    local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
    m_value = (long)&auxTrans;
    poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                       *)&local_1d0);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,&auxTrans);
  local_188 = fVar1 * fVar1;
  fVar13 = (float)local_1e8._0_4_ * (float)local_1e8._0_4_;
  dVar25 = (double)(fVar13 + local_188);
  local_1f8 = ZEXT416((uint)(fVar22 * (float)local_1e8._0_4_));
  local_138 = ZEXT416((uint)(fVar22 * fVar1));
  dVar24 = (double)(((fVar13 * fVar2 + local_188 * fVar2) - fVar22 * (float)local_1e8._0_4_ * fVar3)
                   - fVar22 * fVar1 * fVar4);
  local_178 = -fVar1;
  uStack_174 = 0x80000000;
  uStack_170 = 0x80000000;
  uStack_16c = 0x80000000;
  dVar23 = (double)((float)local_1e8._0_4_ * fVar4 - fVar3 * fVar1);
  fVar14 = fVar22 * fVar22;
  local_198 = (double)CONCAT44(local_1e8._4_4_,fVar13);
  uStack_190 = local_1e8._8_4_;
  uStack_18c = local_1e8._12_4_;
  uStack_184 = 0;
  uStack_180 = 0;
  uStack_17c = 0;
  fVar13 = fVar14 + fVar13 + local_188;
  dVar19 = dVar24 * dVar24 * dVar25 + (double)fVar13 * dVar23 * dVar23 * dVar25;
  dVar16 = SQRT(dVar19);
  dVar17 = dVar16;
  if (dVar19 < 0.0) {
    local_208 = dVar16;
    dVar16 = sqrt(dVar19);
    dVar17 = local_208;
  }
  auxRot.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (float)((1.0 / dVar16) * dVar23 * dVar25);
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.m_value
       = 0;
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.m_value
       = 1;
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)0x1;
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       (PointerType)&auxRot;
  if (dVar19 < 0.0) {
    dVar17 = sqrt(dVar19);
  }
  local_214 = (float)((double)(fVar22 * fVar4 + fVar2 * local_178) * (-1.0 / dVar17) * dVar25);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_1d0,
                      &local_214);
  if (dVar19 < 0.0) {
    dVar16 = sqrt(dVar19);
  }
  else {
    dVar16 = SQRT(dVar19);
  }
  local_218 = (float)((double)(fVar22 * fVar3 - fVar2 * (float)local_1e8._0_4_) * (1.0 / dVar16) *
                     dVar25);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_218);
  if (dVar19 < 0.0) {
    dVar16 = sqrt(dVar19);
  }
  else {
    dVar16 = SQRT(dVar19);
  }
  fVar13 = SQRT(fVar13);
  dVar17 = (double)fVar13;
  local_14c = (float)((((-1.0 / dVar16) * dVar25) / dVar17) * dVar24);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_14c);
  local_208._0_4_ = -(float)local_1f8._0_4_;
  uStack_200 = local_1f8._8_4_ ^ 0x80000000;
  uStack_1fc = local_1f8._12_4_ ^ 0x80000000;
  if (dVar19 < 0.0) {
    local_208 = (double)(local_1f8._0_8_ ^ 0x8000000080000000);
    dVar16 = sqrt(dVar19);
  }
  else {
    dVar16 = SQRT(dVar19);
  }
  fVar12 = (float)local_208 * fVar2;
  local_208._0_4_ = (float)local_1e8._0_4_ * fVar1;
  local_208._4_4_ = local_1e8._4_4_;
  uStack_200 = local_1e8._8_4_;
  uStack_1fc = local_1e8._12_4_;
  local_150 = (float)((double)((fVar12 + fVar14 * fVar3 + local_188 * fVar3) -
                              (float)local_208 * fVar4) * (((-1.0 / dVar16) * dVar25) / dVar17));
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_150);
  fVar12 = (float)local_208;
  fVar9 = -(float)local_138._0_4_;
  if (dVar19 < 0.0) {
    dVar19 = sqrt(dVar19);
  }
  else {
    dVar19 = SQRT(dVar19);
  }
  local_154 = (float)((double)(-fVar12 * fVar3 +
                              fVar9 * fVar2 + fVar14 * fVar4 + (float)local_198 * fVar4) *
                     (((-1.0 / dVar19) * dVar25) / dVar17));
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_154);
  local_158 = fVar22 / fVar13;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_158);
  local_15c = (float)local_1e8._0_4_ / fVar13;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_15c);
  local_160 = fVar1 / fVar13;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar5,&local_160);
  local_1e8._0_8_ = local_1e8._0_8_ ^ 0x8000000080000000;
  local_1e8._8_4_ = local_1e8._8_4_ ^ 0x80000000;
  local_1e8._12_4_ = local_1e8._12_4_ ^ 0x80000000;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_1d0);
  dVar25 = (double)(local_178 * local_210 * fVar4 +
                   (float)local_1e8._0_4_ * local_210 * fVar3 +
                   ((local_168 * local_188 + fVar14 * local_168 + (float)local_198 * local_168) -
                   fVar22 * local_210 * fVar2)) * (-1.0 / dVar17);
  dVar16 = (double)((float)local_1f8._0_4_ * fVar2 * fVar3);
  dVar17 = (double)((float)local_138._0_4_ * fVar2 * fVar4);
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.m_value
       = 0;
  auxT.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  dVar19 = (double)((float)local_208 * fVar3 * fVar4);
  dVar16 = (((double)(fVar3 * fVar3 * local_188 +
                     fVar4 * fVar4 * (float)local_198 +
                     fVar2 * fVar2 * local_188 +
                     fVar14 * fVar4 * fVar4 +
                     fVar14 * fVar3 * fVar3 + (float)local_198 * fVar2 * fVar2) - (dVar16 + dVar16))
           - (dVar17 + dVar17)) - (dVar19 + dVar19);
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.m_value
       = 1;
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)0x1;
  local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       (PointerType)&auxT;
  if (dVar16 < 0.0) {
    local_1e8._0_8_ = dVar25;
    dVar16 = sqrt(dVar16);
    dVar25 = (double)local_1e8._0_8_;
  }
  else {
    dVar16 = SQRT(dVar16);
  }
  local_214 = (float)(dVar25 / dVar16);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_1d0,
                      &local_214);
  local_218 = local_210 / fVar13;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar6,&local_218);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_1d0);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity
            ((IdentityReturnType *)&local_1d0,4,4);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,4,4,0,4,4>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            (&auxTrans,
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
              *)&local_1d0);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>(&local_1d0,&auxTrans,3,3)
  ;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
            (&local_1d0,&auxRot);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_1d0,&auxTrans,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,1,0,3,1>>
            (&local_1d0,&auxT);
  if (verbose) {
    poVar7 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix [V,v;0,0,0,1]");
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&auxTrans);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)");
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)&auxTrans;
    local_1d0.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
    m_value = (long)&auxTrans;
    poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                       *)&local_1d0);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,&auxTrans);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> getPredefinedTransformations2Plane1Line(
	Matrix<floatPrec, 4, 1> Pi1, Matrix<floatPrec, 4, 1> Pi2,
	Matrix<floatPrec, 4, 1> Nu1, Matrix<floatPrec, 4, 1> Nu2,
	bool verbose)
{

	vector<Matrix<floatPrec, 4, 4>> outTrans;
	Matrix<floatPrec, 4, 4> auxTrans;
	Matrix<floatPrec, 3, 3> auxRot;
	Matrix<floatPrec, 3, 1> auxT;

	floatPrec pi11, pi12, pi13, pi14;
	floatPrec pi21, pi22, pi23, pi24;
	floatPrec nu11, nu12, nu13, nu14;
	floatPrec nu21, nu22, nu23, nu24;

	pi11 = Pi1(0);
	pi12 = Pi1(1);
	pi13 = Pi1(2);
	pi14 = Pi1(3);
	pi21 = Pi2(0);
	pi22 = Pi2(1);
	pi23 = Pi2(2);
	pi24 = Pi2(3);
	nu11 = Nu1(0);
	nu12 = Nu1(1);
	nu13 = Nu1(2);
	nu14 = Nu1(3);
	nu21 = Nu2(0);
	nu22 = Nu2(1);
	nu23 = Nu2(2);
	nu24 = Nu2(3);

	// Compute U Matrix
	auxRot << 1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi23 - pi13 * pi22) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi23 - pi13 * pi21) * (pi12 * pi12 + pi13 * pi13),
		1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi22 - pi12 * pi21) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi22 + (pi13 * pi13) * pi22 - pi11 * pi12 * pi21 - pi12 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi23 + (pi12 * pi12) * pi23 - pi11 * pi13 * pi21 - pi12 * pi13 * pi22),
		pi11 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi13 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	// Compute u vector
	auxT << 0.0,
		-1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi24 + (pi12 * pi12) * pi24 + (pi13 * pi13) * pi24 - pi11 * pi14 * pi21 - pi12 * pi14 * pi22 - pi13 * pi14 * pi23) * 1.0 / sqrt((pi11 * pi11) * (pi22 * pi22) + (pi12 * pi12) * (pi21 * pi21) + (pi11 * pi11) * (pi23 * pi23) + (pi13 * pi13) * (pi21 * pi21) + (pi12 * pi12) * (pi23 * pi23) + (pi13 * pi13) * (pi22 * pi22) - pi11 * pi12 * pi21 * pi22 * 2.0 - pi11 * pi13 * pi21 * pi23 * 2.0 - pi12 * pi13 * pi22 * pi23 * 2.0),
		pi14 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [U,u;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add U,u to the output vector
	outTrans.push_back(auxTrans);

	// Compute V Matrix
	auxRot << 1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu23 - nu13 * nu22) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu23 - nu13 * nu21) * (nu12 * nu12 + nu13 * nu13),
		1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu22 - nu12 * nu21) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu22 + (nu13 * nu13) * nu22 - nu11 * nu12 * nu21 - nu12 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu23 + (nu12 * nu12) * nu23 - nu11 * nu13 * nu21 - nu12 * nu13 * nu22),
		nu11 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu13 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	// Compute v vector
	auxT << 0.0,
		-1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu24 + (nu12 * nu12) * nu24 + (nu13 * nu13) * nu24 - nu11 * nu14 * nu21 - nu12 * nu14 * nu22 - nu13 * nu14 * nu23) * 1.0 / sqrt((nu11 * nu11) * (nu22 * nu22) + (nu12 * nu12) * (nu21 * nu21) + (nu11 * nu11) * (nu23 * nu23) + (nu13 * nu13) * (nu21 * nu21) + (nu12 * nu12) * (nu23 * nu23) + (nu13 * nu13) * (nu22 * nu22) - nu11 * nu12 * nu21 * nu22 * 2.0 - nu11 * nu13 * nu21 * nu23 * 2.0 - nu12 * nu13 * nu22 * nu23 * 2.0),
		nu14 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [V,v;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add V,v to the output vector
	outTrans.push_back(auxTrans);

	return outTrans;
}